

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TImage.hpp
# Opt level: O0

time_t __thiscall TUPU::TImage::time_abi_cxx11_(TImage *this,time_t *__timer)

{
  unsigned_long in_stack_00000028;
  
  std::__cxx11::to_string(in_stack_00000028);
  return (time_t)this;
}

Assistant:

const std::string time() const { return std::to_string(m_ts); }